

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O0

uint128 CityHash128WithSeed(char *s,size_t len,uint128 seed)

{
  uint128 seed_00;
  char *pcVar1;
  unsigned_long uVar2;
  uint64 uVar3;
  long lVar4;
  uint64 uVar5;
  uint64 uVar6;
  ulong in_RSI;
  long in_RDI;
  size_t tail_done;
  uint64 z;
  uint64 y;
  uint64 x;
  pair<unsigned_long,_unsigned_long> w;
  pair<unsigned_long,_unsigned_long> v;
  unsigned_long a;
  char *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  unsigned_long in_stack_ffffffffffffff08;
  unsigned_long in_stack_ffffffffffffff10;
  uint64 local_e0;
  unsigned_long local_d8;
  pair<unsigned_long,_unsigned_long> local_d0;
  ulong local_c0;
  pair<unsigned_long,_unsigned_long> local_b8;
  pair<unsigned_long,_unsigned_long> local_a8;
  pair<unsigned_long,_unsigned_long> local_98;
  pair<unsigned_long,_unsigned_long> local_88;
  unsigned_long local_78;
  char *local_70;
  uint64 local_68;
  pair<unsigned_long,_unsigned_long> local_60;
  pair<unsigned_long,_unsigned_long> local_50 [2];
  ulong local_30;
  long local_28;
  uint128 local_20;
  uint128 local_10;
  
  if (in_RSI < 0x80) {
    seed_00.second = in_stack_ffffffffffffff10;
    seed_00.first = in_stack_ffffffffffffff08;
    local_10 = CityMurmur(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,seed_00);
  }
  else {
    local_30 = in_RSI;
    local_28 = in_RDI;
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>(local_50);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>(&local_60);
    local_68 = Uint128Low64(&local_20);
    local_70 = (char *)Uint128High64(&local_20);
    local_78 = local_30 * -0x4b6d499041670d8d;
    uVar3 = Rotate((ulong)local_70 ^ 0xb492b66fbe98f273,0x31);
    lVar4 = uVar3 * -0x4b6d499041670d8d;
    local_50[0].first = Fetch64((char *)0x1aaeca);
    local_50[0].first = lVar4 + local_50[0].first;
    uVar3 = Rotate(local_50[0].first,0x2a);
    lVar4 = uVar3 * -0x4b6d499041670d8d;
    uVar3 = Fetch64((char *)0x1aaf13);
    local_50[0].second = lVar4 + uVar3;
    uVar5 = Rotate((long)local_70 + local_78,0x23);
    uVar3 = local_68;
    local_60.first = uVar5 * -0x4b6d499041670d8d + local_68;
    uVar5 = Fetch64((char *)0x1aaf7f);
    uVar3 = Rotate(uVar3 + uVar5,0x35);
    local_60.second = uVar3 * -0x4b6d499041670d8d;
    do {
      uVar3 = local_68 + (long)local_70 + local_50[0].first;
      uVar5 = Fetch64((char *)0x1aafd8);
      uVar5 = Rotate(uVar3 + uVar5,0x25);
      local_68 = uVar5 * -0x4b6d499041670d8d;
      uVar5 = (long)local_70 + local_50[0].second;
      uVar6 = Fetch64((char *)0x1ab026);
      uVar6 = Rotate(uVar5 + uVar6,0x2a);
      local_70 = (char *)(uVar6 * -0x4b6d499041670d8d);
      local_68 = local_60.second ^ local_68;
      a = local_50[0].first;
      uVar6 = Fetch64((char *)0x1ab084);
      local_70 = (char *)(a + uVar6 + (long)local_70);
      uVar6 = Rotate(local_78 + local_60.first,0x21);
      local_78 = uVar6 * -0x4b6d499041670d8d;
      local_88 = WeakHashLen32WithSeeds(in_stack_fffffffffffffec0,a,uVar5);
      std::pair<unsigned_long,_unsigned_long>::operator=(local_50,&local_88);
      in_stack_fffffffffffffec0 = local_70;
      Fetch64((char *)0x1ab168);
      local_98 = WeakHashLen32WithSeeds(in_stack_fffffffffffffec0,a,uVar5);
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_60,&local_98);
      std::swap<unsigned_long>(&local_78,&local_68);
      pcVar1 = local_70;
      local_28 = local_28 + 0x40;
      lVar4 = local_50[0].first + local_68;
      uVar6 = Fetch64((char *)0x1ab1fb);
      uVar6 = Rotate((uint64)(pcVar1 + uVar6 + lVar4),0x25);
      uVar2 = local_50[0].second;
      pcVar1 = local_70;
      local_68 = uVar6 * -0x4b6d499041670d8d;
      uVar6 = Fetch64((char *)0x1ab249);
      uVar6 = Rotate((uint64)(pcVar1 + uVar6 + uVar2),0x2a);
      uVar2 = local_50[0].first;
      local_70 = (char *)(uVar6 * -0x4b6d499041670d8d);
      local_68 = local_60.second ^ local_68;
      uVar6 = Fetch64((char *)0x1ab2a7);
      local_70 = (char *)(uVar2 + uVar6 + (long)local_70);
      uVar6 = Rotate(local_78 + local_60.first,0x21);
      local_78 = uVar6 * -0x4b6d499041670d8d;
      local_a8 = WeakHashLen32WithSeeds(in_stack_fffffffffffffec0,a,uVar5);
      std::pair<unsigned_long,_unsigned_long>::operator=(local_50,&local_a8);
      Fetch64((char *)0x1ab38b);
      local_b8 = WeakHashLen32WithSeeds(in_stack_fffffffffffffec0,a,uVar5);
      std::pair<unsigned_long,_unsigned_long>::operator=(&local_60,&local_b8);
      std::swap<unsigned_long>(&local_78,&local_68);
      local_28 = local_28 + 0x40;
      local_30 = local_30 - 0x80;
    } while (0x7f < local_30);
    uVar6 = Rotate(local_50[0].first + local_78,0x31);
    local_68 = uVar6 * -0x3c5a37a36834ced9 + local_68;
    uVar6 = Rotate(local_60.first,0x25);
    local_78 = uVar6 * -0x3c5a37a36834ced9 + local_78;
    local_c0 = 0;
    while (local_c0 < local_30) {
      local_c0 = local_c0 + 0x20;
      uVar6 = Rotate(local_68 + (long)local_70,0x2a);
      local_70 = (char *)(uVar6 * -0x3c5a37a36834ced9 + local_50[0].second);
      uVar6 = Fetch64((char *)0x1ab51d);
      uVar2 = local_60.second;
      local_60.first = uVar6 + local_60.first;
      local_68 = local_68 * -0x3c5a37a36834ced9 + local_60.first;
      uVar6 = Fetch64((char *)0x1ab57f);
      local_78 = uVar2 + uVar6 + local_78;
      local_60.second = local_50[0].first + local_60.second;
      local_d0 = WeakHashLen32WithSeeds(in_stack_fffffffffffffec0,a,uVar5);
      std::pair<unsigned_long,_unsigned_long>::operator=(local_50,&local_d0);
    }
    local_68 = HashLen16(uVar5,uVar3);
    local_70 = (char *)HashLen16(uVar5,uVar3);
    uVar6 = HashLen16(uVar5,uVar3);
    local_d8 = uVar6 + (long)local_70;
    local_e0 = HashLen16(uVar5,uVar3);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              (&local_10,&local_d8,&local_e0);
  }
  return local_10;
}

Assistant:

uint128 CityHash128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64, uint64> v, w;
  uint64 x = Uint128Low64(seed);
  uint64 y = Uint128High64(seed);
  uint64 z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch64(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch64(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch64(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  x += Rotate(v.first + z, 49) * k0;
  z += Rotate(w.first, 37) * k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(x + y, 42) * k0 + v.second;
    w.first += Fetch64(s + len - tail_done + 16);
    x = x * k0 + w.first;
    z += w.second + Fetch64(s + len - tail_done);
    w.second += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first + z, v.second);
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y + z, w.first);
  return uint128(HashLen16(x + v.second, w.second) + y,
                 HashLen16(x + w.second, y + v.second));
}